

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMAttrMapImpl.cpp
# Opt level: O0

DOMNode * __thiscall xercesc_4_0::DOMAttrMapImpl::setNamedItem(DOMAttrMapImpl *this,DOMNode *arg)

{
  bool bVar1;
  int iVar2;
  DOMException *pDVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  DOMDocument *doc_00;
  DOMNodeImpl *pDVar4;
  DOMDocument *pDVar5;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  DOMNodeVector *this_00;
  DOMNode *local_178;
  DOMDocumentImpl *local_160;
  MemoryManager *local_150;
  DOMDocumentImpl *local_140;
  long local_130;
  MemoryManager *local_120;
  MemoryManager *local_110;
  DOMDocumentImpl *local_100;
  long local_f0;
  MemoryManager *local_e0;
  MemoryManager *local_d0;
  DOMDocumentImpl *local_c0;
  long local_b0;
  MemoryManager *local_a0;
  MemoryManager *local_90;
  DOMDocumentImpl *local_80;
  long local_70;
  MemoryManager *local_60;
  DOMNode *local_48;
  DOMNode *previous;
  int i;
  DOMNodeImpl *argImpl;
  DOMDocument *doc;
  DOMNode *arg_local;
  DOMAttrMapImpl *this_local;
  undefined4 extraout_var_01;
  
  iVar2 = (*arg->_vptr_DOMNode[4])();
  if (iVar2 != 2) {
    pDVar3 = (DOMException *)__cxa_allocate_exception(0x28);
    if (this->fOwnerNode == (DOMNode *)0x0) {
      local_60 = XMLPlatformUtils::fgMemoryManager;
    }
    else {
      iVar2 = (*this->fOwnerNode->_vptr_DOMNode[0xc])();
      if (CONCAT44(extraout_var,iVar2) == 0) {
        local_70 = 0;
      }
      else {
        local_70 = CONCAT44(extraout_var,iVar2) + -8;
      }
      if (local_70 == 0) {
        local_90 = XMLPlatformUtils::fgMemoryManager;
      }
      else {
        iVar2 = (*this->fOwnerNode->_vptr_DOMNode[0xc])();
        if (CONCAT44(extraout_var_00,iVar2) == 0) {
          local_80 = (DOMDocumentImpl *)0x0;
        }
        else {
          local_80 = (DOMDocumentImpl *)(CONCAT44(extraout_var_00,iVar2) + -8);
        }
        local_90 = DOMDocumentImpl::getMemoryManager(local_80);
      }
      local_60 = local_90;
    }
    DOMException::DOMException(pDVar3,3,0,local_60);
    __cxa_throw(pDVar3,&DOMException::typeinfo,DOMException::~DOMException);
  }
  iVar2 = (*this->fOwnerNode->_vptr_DOMNode[0xc])();
  doc_00 = (DOMDocument *)CONCAT44(extraout_var_01,iVar2);
  pDVar4 = xercesc_4_0::castToNodeImpl(arg);
  pDVar5 = DOMNodeImpl::getOwnerDocument(pDVar4);
  if (pDVar5 != doc_00) {
    pDVar3 = (DOMException *)__cxa_allocate_exception(0x28);
    if (this->fOwnerNode == (DOMNode *)0x0) {
      local_a0 = XMLPlatformUtils::fgMemoryManager;
    }
    else {
      iVar2 = (*this->fOwnerNode->_vptr_DOMNode[0xc])();
      if (CONCAT44(extraout_var_02,iVar2) == 0) {
        local_b0 = 0;
      }
      else {
        local_b0 = CONCAT44(extraout_var_02,iVar2) + -8;
      }
      if (local_b0 == 0) {
        local_d0 = XMLPlatformUtils::fgMemoryManager;
      }
      else {
        iVar2 = (*this->fOwnerNode->_vptr_DOMNode[0xc])();
        if (CONCAT44(extraout_var_03,iVar2) == 0) {
          local_c0 = (DOMDocumentImpl *)0x0;
        }
        else {
          local_c0 = (DOMDocumentImpl *)(CONCAT44(extraout_var_03,iVar2) + -8);
        }
        local_d0 = DOMDocumentImpl::getMemoryManager(local_c0);
      }
      local_a0 = local_d0;
    }
    DOMException::DOMException(pDVar3,4,0,local_a0);
    __cxa_throw(pDVar3,&DOMException::typeinfo,DOMException::~DOMException);
  }
  bVar1 = readOnly(this);
  if (bVar1) {
    pDVar3 = (DOMException *)__cxa_allocate_exception(0x28);
    if (this->fOwnerNode == (DOMNode *)0x0) {
      local_e0 = XMLPlatformUtils::fgMemoryManager;
    }
    else {
      iVar2 = (*this->fOwnerNode->_vptr_DOMNode[0xc])();
      if (CONCAT44(extraout_var_04,iVar2) == 0) {
        local_f0 = 0;
      }
      else {
        local_f0 = CONCAT44(extraout_var_04,iVar2) + -8;
      }
      if (local_f0 == 0) {
        local_110 = XMLPlatformUtils::fgMemoryManager;
      }
      else {
        iVar2 = (*this->fOwnerNode->_vptr_DOMNode[0xc])();
        if (CONCAT44(extraout_var_05,iVar2) == 0) {
          local_100 = (DOMDocumentImpl *)0x0;
        }
        else {
          local_100 = (DOMDocumentImpl *)(CONCAT44(extraout_var_05,iVar2) + -8);
        }
        local_110 = DOMDocumentImpl::getMemoryManager(local_100);
      }
      local_e0 = local_110;
    }
    DOMException::DOMException(pDVar3,7,0,local_e0);
    __cxa_throw(pDVar3,&DOMException::typeinfo,DOMException::~DOMException);
  }
  iVar2 = (*arg->_vptr_DOMNode[4])();
  if (((iVar2 == 2) && (bVar1 = DOMNodeImpl::isOwned(pDVar4), bVar1)) &&
     (pDVar4->fOwnerNode != this->fOwnerNode)) {
    pDVar3 = (DOMException *)__cxa_allocate_exception(0x28);
    if (this->fOwnerNode == (DOMNode *)0x0) {
      local_120 = XMLPlatformUtils::fgMemoryManager;
    }
    else {
      iVar2 = (*this->fOwnerNode->_vptr_DOMNode[0xc])();
      if (CONCAT44(extraout_var_06,iVar2) == 0) {
        local_130 = 0;
      }
      else {
        local_130 = CONCAT44(extraout_var_06,iVar2) + -8;
      }
      if (local_130 == 0) {
        local_150 = XMLPlatformUtils::fgMemoryManager;
      }
      else {
        iVar2 = (*this->fOwnerNode->_vptr_DOMNode[0xc])();
        if (CONCAT44(extraout_var_07,iVar2) == 0) {
          local_140 = (DOMDocumentImpl *)0x0;
        }
        else {
          local_140 = (DOMDocumentImpl *)(CONCAT44(extraout_var_07,iVar2) + -8);
        }
        local_150 = DOMDocumentImpl::getMemoryManager(local_140);
      }
      local_120 = local_150;
    }
    DOMException::DOMException(pDVar3,10,0,local_120);
    __cxa_throw(pDVar3,&DOMException::typeinfo,DOMException::~DOMException);
  }
  pDVar4->fOwnerNode = this->fOwnerNode;
  DOMNodeImpl::isOwned(pDVar4,true);
  iVar2 = (*arg->_vptr_DOMNode[2])();
  iVar2 = (*(this->super_DOMNamedNodeMap)._vptr_DOMNamedNodeMap[0xe])
                    (this,CONCAT44(extraout_var_08,iVar2));
  local_48 = (DOMNode *)0x0;
  if (iVar2 < 0) {
    if (this->fNodes == (DOMNodeVector *)0x0) {
      if (doc_00 == (DOMDocument *)0x0) {
        local_160 = (DOMDocumentImpl *)0x0;
      }
      else {
        local_160 = (DOMDocumentImpl *)&doc_00[-1].super_DOMNode;
      }
      this_00 = (DOMNodeVector *)operator_new(0x18,local_160);
      DOMNodeVector::DOMNodeVector(this_00,doc_00);
      this->fNodes = this_00;
    }
    DOMNodeVector::insertElementAt(this->fNodes,arg,(long)(-1 - iVar2));
  }
  else {
    local_48 = DOMNodeVector::elementAt(this->fNodes,(long)iVar2);
    DOMNodeVector::setElementAt(this->fNodes,arg,(long)iVar2);
  }
  if (local_48 != (DOMNode *)0x0) {
    local_178 = (DOMNode *)0x0;
    if (doc_00 != (DOMDocument *)0x0) {
      local_178 = &doc_00->super_DOMNode;
    }
    pDVar4 = xercesc_4_0::castToNodeImpl(local_48);
    pDVar4->fOwnerNode = local_178;
    pDVar4 = xercesc_4_0::castToNodeImpl(local_48);
    DOMNodeImpl::isOwned(pDVar4,false);
  }
  return local_48;
}

Assistant:

DOMNode *DOMAttrMapImpl::setNamedItem(DOMNode *arg)
{
    if (arg->getNodeType() != DOMNode::ATTRIBUTE_NODE)
        throw DOMException(DOMException::HIERARCHY_REQUEST_ERR, 0, GetDOMNamedNodeMapMemoryManager);

    DOMDocument *doc = fOwnerNode->getOwnerDocument();
    DOMNodeImpl *argImpl = castToNodeImpl(arg);
    if(argImpl->getOwnerDocument() != doc)
        throw DOMException(DOMException::WRONG_DOCUMENT_ERR, 0, GetDOMNamedNodeMapMemoryManager);
    if (this->readOnly())
        throw DOMException(DOMException::NO_MODIFICATION_ALLOWED_ERR, 0, GetDOMNamedNodeMapMemoryManager);
    if ((arg->getNodeType() == DOMNode::ATTRIBUTE_NODE) && argImpl->isOwned() && (argImpl->fOwnerNode != fOwnerNode))
        throw DOMException(DOMException::INUSE_ATTRIBUTE_ERR,0, GetDOMNamedNodeMapMemoryManager);

    argImpl->fOwnerNode = fOwnerNode;
    argImpl->isOwned(true);
    int i=findNamePoint(arg->getNodeName());
    DOMNode * previous=0;
    if(i>=0)
    {
        previous = fNodes->elementAt(i);
        fNodes->setElementAt(arg,i);
    }
    else
    {
        i=-1-i; // Insert point (may be end of list)
        if(0==fNodes)
        {
            fNodes=new ((DOMDocumentImpl*)doc) DOMNodeVector(doc);
        }
        fNodes->insertElementAt(arg,i);
    }
    if (previous != 0) {
        castToNodeImpl(previous)->fOwnerNode = doc;
        castToNodeImpl(previous)->isOwned(false);
    }

    return previous;
}